

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ReduceLoadSize::ReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  initializer_list<unsigned_int> __l;
  uint uVar1;
  pointer type;
  undefined4 type_id;
  Op OVar2;
  uint32_t uVar3;
  Kind KVar4;
  Analysis preserved_analyses;
  uint32_t uVar5;
  IRContext *pIVar6;
  DefUseManager *this_00;
  TypeManager *this_01;
  ConstantManager *this_02;
  Instruction *pIVar7;
  Type *this_03;
  Instruction *pIVar8;
  Constant *c;
  Instruction *new_load;
  Instruction *local_128;
  Instruction *new_access_chain;
  allocator<unsigned_int> local_115;
  uint32_t local_114;
  iterator local_110;
  size_type local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  Constant *local_e8;
  Constant *index_const;
  uint32_t index;
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  Type *uint32_type;
  Integer int_type;
  undefined1 local_80 [4];
  uint32_t pointer_to_result_type_id;
  InstructionBuilder ir_builder;
  StorageClass storage_class;
  Instruction *var;
  Type *composite_type;
  Instruction *composite_inst;
  uint32_t composite_id;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  ReduceLoadSize *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 != OpCompositeExtract) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract && \"Wrong opcode.  Should be OpCompositeExtract.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                  ,0x33,"bool spvtools::opt::ReduceLoadSize::ReplaceExtract(Instruction *)");
  }
  pIVar6 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_def_use_mgr(pIVar6);
  pIVar6 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(pIVar6);
  pIVar6 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_constant_mgr(pIVar6);
  uVar3 = opt::Instruction::GetSingleWordInOperand(inst,0);
  pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar3);
  OVar2 = opt::Instruction::opcode(pIVar7);
  if (OVar2 == OpLoad) {
    uVar3 = opt::Instruction::type_id(pIVar7);
    this_03 = analysis::TypeManager::GetType(this_01,uVar3);
    KVar4 = analysis::Type::kind(this_03);
    if ((KVar4 == kVector) || (KVar4 = analysis::Type::kind(this_03), KVar4 == kMatrix)) {
      this_local._7_1_ = false;
    }
    else {
      pIVar8 = opt::Instruction::GetBaseAddress(pIVar7);
      if ((pIVar8 == (Instruction *)0x0) ||
         (OVar2 = opt::Instruction::opcode(pIVar8), OVar2 != OpVariable)) {
        this_local._7_1_ = false;
      }
      else {
        ir_builder._28_4_ = opt::Instruction::GetSingleWordInOperand(pIVar8,0);
        if ((uint)ir_builder._28_4_ < 3) {
          pIVar6 = opt::Instruction::context(inst);
          preserved_analyses = opt::operator|(kAnalysisInstrToBlockMapping,kAnalysisBegin);
          InstructionBuilder::InstructionBuilder
                    ((InstructionBuilder *)local_80,pIVar6,pIVar7,preserved_analyses);
          uVar3 = opt::Instruction::type_id(inst);
          int_type._44_4_ =
               analysis::TypeManager::FindPointerToType(this_01,uVar3,ir_builder._28_4_);
          if (int_type._44_4_ == 0) {
            __assert_fail("pointer_to_result_type_id != 0 && \"We did not find the pointer type that we need.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                          ,0x60,"bool spvtools::opt::ReduceLoadSize::ReplaceExtract(Instruction *)")
            ;
          }
          analysis::Integer::Integer((Integer *)&uint32_type,0x20,false);
          ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)analysis::TypeManager::GetRegisteredType(this_01,(Type *)&uint32_type);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index);
          for (index_const._4_4_ = 1; uVar1 = index_const._4_4_,
              uVar3 = opt::Instruction::NumInOperands(inst), type_id = int_type._44_4_,
              uVar1 < uVar3; index_const._4_4_ = index_const._4_4_ + 1) {
            local_114 = opt::Instruction::GetSingleWordInOperand(inst,index_const._4_4_);
            type = ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            local_110 = &local_114;
            local_108 = 1;
            index_const._0_4_ = local_114;
            std::allocator<unsigned_int>::allocator(&local_115);
            __l._M_len = local_108;
            __l._M_array = local_110;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_100,__l,&local_115);
            c = analysis::ConstantManager::GetConstant(this_02,(Type *)type,&local_100);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
            std::allocator<unsigned_int>::~allocator(&local_115);
            local_e8 = c;
            pIVar8 = analysis::ConstantManager::GetDefiningInstruction
                               (this_02,c,0,(inst_iterator *)0x0);
            new_access_chain._4_4_ = opt::Instruction::result_id(pIVar8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index,
                       (value_type_conflict *)((long)&new_access_chain + 4));
          }
          uVar3 = opt::Instruction::GetSingleWordInOperand(pIVar7,0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_load,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index);
          pIVar7 = InstructionBuilder::AddAccessChain
                             ((InstructionBuilder *)local_80,type_id,uVar3,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_load);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_load);
          local_128 = pIVar7;
          uVar3 = opt::Instruction::type_id(inst);
          uVar5 = opt::Instruction::result_id(local_128);
          pIVar7 = InstructionBuilder::AddLoad((InstructionBuilder *)local_80,uVar3,uVar5,0);
          pIVar6 = Pass::context(&this->super_Pass);
          uVar3 = opt::Instruction::result_id(inst);
          uVar5 = opt::Instruction::result_id(pIVar7);
          IRContext::ReplaceAllUsesWith(pIVar6,uVar3,uVar5);
          pIVar6 = Pass::context(&this->super_Pass);
          IRContext::KillInst(pIVar6,inst);
          this_local._7_1_ = true;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index);
          analysis::Integer::~Integer((Integer *)&uint32_type);
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ReduceLoadSize::ReplaceExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract &&
         "Wrong opcode.  Should be OpCompositeExtract.");
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  uint32_t composite_id =
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* composite_inst = def_use_mgr->GetDef(composite_id);

  if (composite_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  analysis::Type* composite_type = type_mgr->GetType(composite_inst->type_id());
  if (composite_type->kind() == analysis::Type::kVector ||
      composite_type->kind() == analysis::Type::kMatrix) {
    return false;
  }

  Instruction* var = composite_inst->GetBaseAddress();
  if (var == nullptr || var->opcode() != spv::Op::OpVariable) {
    return false;
  }

  spv::StorageClass storage_class = static_cast<spv::StorageClass>(
      var->GetSingleWordInOperand(kVariableStorageClassInIdx));
  switch (storage_class) {
    case spv::StorageClass::Uniform:
    case spv::StorageClass::UniformConstant:
    case spv::StorageClass::Input:
      break;
    default:
      return false;
  }

  // Create a new access chain and load just after the old load.
  // We cannot create the new access chain load in the position of the extract
  // because the storage may have been written to in between.
  InstructionBuilder ir_builder(
      inst->context(), composite_inst,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);

  uint32_t pointer_to_result_type_id =
      type_mgr->FindPointerToType(inst->type_id(), storage_class);
  assert(pointer_to_result_type_id != 0 &&
         "We did not find the pointer type that we need.");

  analysis::Integer int_type(32, false);
  const analysis::Type* uint32_type = type_mgr->GetRegisteredType(&int_type);
  std::vector<uint32_t> ids;
  for (uint32_t i = 1; i < inst->NumInOperands(); ++i) {
    uint32_t index = inst->GetSingleWordInOperand(i);
    const analysis::Constant* index_const =
        const_mgr->GetConstant(uint32_type, {index});
    ids.push_back(const_mgr->GetDefiningInstruction(index_const)->result_id());
  }

  Instruction* new_access_chain = ir_builder.AddAccessChain(
      pointer_to_result_type_id,
      composite_inst->GetSingleWordInOperand(kLoadPointerInIdx), ids);
  Instruction* new_load =
      ir_builder.AddLoad(inst->type_id(), new_access_chain->result_id());

  context()->ReplaceAllUsesWith(inst->result_id(), new_load->result_id());
  context()->KillInst(inst);
  return true;
}